

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::
read_internal(basic_csv_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
             error_code *ec)

{
  basic_istream<char,_std::char_traits<char>_> *pbVar1;
  char *pcVar2;
  span<const_char,_18446744073709551615UL> sVar3;
  
  pbVar1 = (this->source_).source_.stream_ptr_;
  if (((&pbVar1->field_0x20)[(long)pbVar1->_vptr_basic_istream[-3]] & 1) != 0) {
    std::error_code::operator=(ec,source_error);
    return;
  }
  do {
    if ((this->parser_).more_ != true) {
      return;
    }
    if ((this->parser_).input_ptr_ == (this->parser_).input_end_) {
      sVar3 = text_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(&this->source_,ec);
      pcVar2 = sVar3.data_;
      if (ec->_M_value != 0) {
        return;
      }
      if (sVar3.size_ != 0) {
        (this->parser_).begin_input_ = pcVar2;
        (this->parser_).input_end_ = pcVar2 + sVar3.size_;
        (this->parser_).input_ptr_ = pcVar2;
      }
    }
    basic_csv_parser<char,_std::allocator<char>_>::parse_some(&this->parser_,this->visitor_,ec);
  } while (ec->_M_value == 0);
  return;
}

Assistant:

void read_internal(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = csv_errc::source_error;
                return;
            }   
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
        }